

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O0

int forcingStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  int iVar1;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  double dVar2;
  sunrealtype hinv;
  SUNStepper s1;
  SUNErrCode err;
  sunrealtype tret;
  sunrealtype tout;
  SUNStepper s0;
  int retval;
  ARKodeForcingStepMem step_mem;
  ARKodeForcingStepMem *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  ARKodeMem in_stack_ffffffffffffffa8;
  undefined8 uVar3;
  undefined8 local_48;
  double local_40;
  undefined8 local_38;
  int local_2c;
  undefined8 *local_28;
  undefined4 *local_20;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  local_28 = (undefined8 *)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_2c = forcingStep_AccessStepMem
                       (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
  local_4 = local_2c;
  if (local_2c == 0) {
    *local_20 = 0;
    *local_18 = 0;
    local_38 = *local_28;
    local_40 = *(double *)(local_10 + 0x380) + *(double *)(local_10 + 0x2c0);
    local_48 = 0;
    iVar1 = SUNStepper_Reset(*(undefined8 *)(local_10 + 0x380),local_38,
                             *(undefined8 *)(local_10 + 0x250));
    if (iVar1 == 0) {
      iVar1 = SUNStepper_SetStopTime(local_40,local_38);
      if (iVar1 == 0) {
        iVar1 = SUNStepper_Evolve(local_40,local_38,*(undefined8 *)(local_10 + 0x248),&local_48);
        if (iVar1 == 0) {
          local_28[2] = local_28[2] + 1;
          uVar3 = local_28[1];
          iVar1 = SUNStepper_SetStopTime(local_40,uVar3);
          if (iVar1 == 0) {
            dVar2 = 1.0 / *(double *)(local_10 + 0x2c0);
            N_VLinearSum(dVar2,-dVar2,*(undefined8 *)(local_10 + 0x248),
                         *(undefined8 *)(local_10 + 0x250),*(undefined8 *)(local_10 + 0x268));
            iVar1 = SUNStepper_SetForcing(0,uVar3,local_10 + 0x268,1);
            if (iVar1 == 0) {
              iVar1 = SUNStepper_Evolve(local_40,uVar3,*(undefined8 *)(local_10 + 0x248),&local_48);
              if (iVar1 == 0) {
                local_28[3] = local_28[3] + 1;
                iVar1 = SUNStepper_SetForcing(0,uVar3,0,0);
                if (iVar1 == 0) {
                  local_4 = 0;
                }
                else {
                  local_4 = -0x33;
                }
              }
              else {
                local_4 = -0x33;
              }
            }
            else {
              local_4 = -0x33;
            }
          }
          else {
            local_4 = -0x33;
          }
        }
        else {
          local_4 = -0x33;
        }
      }
      else {
        local_4 = -0x33;
      }
    }
    else {
      local_4 = -0x33;
    }
  }
  return local_4;
}

Assistant:

static int forcingStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                int* nflagPtr)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  *nflagPtr = ARK_SUCCESS; /* No algebraic solver */
  *dsmPtr   = ZERO;        /* No error estimate */

  SUNStepper s0    = step_mem->stepper[0];
  sunrealtype tout = ark_mem->tn + ark_mem->h;
  sunrealtype tret = ZERO;

  /* Evolve stepper 0 on its own */
  SUNLogInfo(ARK_LOGGER, "begin-partition", "partition = 0");

  SUNErrCode err = SUNStepper_Reset(s0, ark_mem->tn, ark_mem->yn);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed stepper reset, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetStopTime(s0, tout);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set stop time, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_Evolve(s0, tout, ark_mem->ycur, &tret);
  SUNLogExtraDebugVec(ARK_LOGGER, "partition state", ark_mem->ycur, "y_par(:) =");
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition", "status = failed evolve, err = %i",
               err);
    return ARK_SUNSTEPPER_ERR;
  }
  step_mem->n_stepper_evolves[0]++;

  SUNLogInfo(ARK_LOGGER, "end-partition", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-partition", "partition = 1");

  SUNStepper s1 = step_mem->stepper[1];
  /* A reset is not needed because steeper 1's state is consistent with the
   * forcing method */
  err = SUNStepper_SetStopTime(s1, tout);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set stop time, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  /* Write tendency (ycur - yn)/h into stepper 1 forcing */
  sunrealtype hinv = SUN_RCONST(1.0) / ark_mem->h;
  N_VLinearSum(hinv, ark_mem->ycur, -hinv, ark_mem->yn, ark_mem->tempv1);
  err = SUNStepper_SetForcing(s1, ZERO, ZERO, &ark_mem->tempv1, 1);
  SUNLogExtraDebugVec(ARK_LOGGER, "forcing", ark_mem->tempv1, "forcing(:) =");
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set forcing, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  /* Evolve stepper 1 with the forcing */
  err = SUNStepper_Evolve(s1, tout, ark_mem->ycur, &tret);
  SUNLogExtraDebugVec(ARK_LOGGER, "partition state", ark_mem->ycur, "y_par(:) =");
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition", "status = failed evolve, err = %i",
               err);
    return ARK_SUNSTEPPER_ERR;
  }
  step_mem->n_stepper_evolves[1]++;

  /* Clear the forcing so it doesn't get included in a fullRhs call */
  err = SUNStepper_SetForcing(s1, ZERO, ZERO, NULL, 0);
  if (err != SUN_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-partition",
               "status = failed set forcing, err = %i", err);
    return ARK_SUNSTEPPER_ERR;
  }

  SUNLogInfo(ARK_LOGGER, "end-partition", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");

  return ARK_SUCCESS;
}